

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O1

void __thiscall rengine::OpenGLRenderer::render(OpenGLRenderer *this,Element *first,Element *last)

{
  char cVar1;
  uint uVar2;
  Node *pNVar3;
  vec2 *pvVar4;
  vec2 renderSize;
  vec2 textureSize;
  mat4 matrix;
  mat4 o;
  GLuint GVar5;
  Format format;
  long lVar6;
  undefined4 *puVar7;
  mat4 *pmVar8;
  undefined8 *puVar9;
  float *pfVar10;
  undefined8 *puVar11;
  TexturePool *this_00;
  RenderNode *rn;
  Element *e;
  int iVar12;
  int iVar13;
  byte bVar14;
  float fVar15;
  float in_stack_fffffffffffffe08 [16];
  float local_1a8 [2];
  mat4 storedProj;
  undefined8 local_120 [8];
  uint local_e0;
  vec2 local_d8;
  undefined8 uStack_d0;
  vec2 local_c8;
  undefined8 uStack_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined4 local_90;
  float local_8c;
  undefined8 local_88;
  undefined4 local_80;
  float local_7c;
  undefined8 local_78;
  undefined4 local_70;
  undefined8 local_6c;
  undefined8 uStack_64;
  undefined8 local_5c;
  Element *local_50;
  float local_44;
  mat4 *local_40;
  TexturePool *local_38;
  
  bVar14 = 0;
  e = first;
  if (first < last && this->m_numLayeredNodes != 0) {
    do {
      if ((e->field_0x1b & 0x40) != 0) {
        renderToLayer(this,e);
        e = e + (*(uint *)&e->field_0x18 & 0x1fffffff);
      }
      e = e + 1;
    } while (e < last);
  }
  glViewport(0,0,(int)(this->m_surfaceSize).x,(int)(this->m_surfaceSize).y);
  if (first < last) {
    local_38 = &this->m_texturePool;
    local_40 = &this->m_proj;
    local_50 = last;
    do {
      uVar2 = *(uint *)&first->field_0x18;
      if (-1 < (int)uVar2) {
        pNVar3 = first->node;
        cVar1 = pNVar3->field_0x30;
        switch(cVar1) {
        case '\x02':
          if ((uVar2 < 0x40000000) || (first->texture == 0)) {
            if (0x3fffffff < uVar2 && cVar1 == '\x03') goto LAB_0012b61e;
            goto LAB_0012b666;
          }
          drawTextureQuad(this,first->vboOffset,first->texture,*(float *)&pNVar3->field_0x34,RGBA_32
                         );
LAB_0012b6df:
          GVar5 = first->texture;
          this_00 = local_38;
          goto LAB_0012b8dd;
        case '\x03':
          if (0x3fffffff < uVar2) {
LAB_0012b61e:
            GVar5 = first->texture;
            if (GVar5 != 0) {
              uVar2 = first->vboOffset;
              puVar7 = (undefined4 *)&pNVar3->field_0x34;
              puVar9 = local_120;
              for (lVar6 = 0x11; lVar6 != 0; lVar6 = lVar6 + -1) {
                *(undefined4 *)puVar9 = *puVar7;
                puVar7 = puVar7 + (ulong)bVar14 * -2 + 1;
                puVar9 = (undefined8 *)((long)puVar9 + (ulong)bVar14 * -8 + 4);
              }
              puVar9 = local_120;
              puVar11 = (undefined8 *)&stack0xfffffffffffffe08;
              for (lVar6 = 8; lVar6 != 0; lVar6 = lVar6 + -1) {
                *puVar11 = *puVar9;
                puVar9 = puVar9 + (ulong)bVar14 * -2 + 1;
                puVar11 = puVar11 + (ulong)bVar14 * -2 + 1;
              }
              matrix.type = local_e0;
              matrix.m[0] = in_stack_fffffffffffffe08[0];
              matrix.m[1] = in_stack_fffffffffffffe08[1];
              matrix.m[2] = in_stack_fffffffffffffe08[2];
              matrix.m[3] = in_stack_fffffffffffffe08[3];
              matrix.m[4] = in_stack_fffffffffffffe08[4];
              matrix.m[5] = in_stack_fffffffffffffe08[5];
              matrix.m[6] = in_stack_fffffffffffffe08[6];
              matrix.m[7] = in_stack_fffffffffffffe08[7];
              matrix.m[8] = in_stack_fffffffffffffe08[8];
              matrix.m[9] = in_stack_fffffffffffffe08[9];
              matrix.m[10] = in_stack_fffffffffffffe08[10];
              matrix.m[0xb] = in_stack_fffffffffffffe08[0xb];
              matrix.m[0xc] = in_stack_fffffffffffffe08[0xc];
              matrix.m[0xd] = in_stack_fffffffffffffe08[0xd];
              matrix.m[0xe] = in_stack_fffffffffffffe08[0xe];
              matrix.m[0xf] = in_stack_fffffffffffffe08[0xf];
              drawColorFilterQuad(this,uVar2,GVar5,matrix);
              goto LAB_0012b6df;
            }
          }
LAB_0012b666:
          if (0x3fffffff < uVar2 && cVar1 == '\x04') {
LAB_0012b67a:
            if (first->texture != 0) {
              uVar2 = first->vboOffset;
              pvVar4 = this->m_vertices;
              fVar15 = pvVar4[uVar2 + 0xb].y - pvVar4[uVar2 + 8].y;
              renderSize.y = fVar15;
              renderSize.x = pvVar4[uVar2 + 0xb].x - pvVar4[uVar2 + 8].x;
              textureSize.y = pvVar4[uVar2 + 7].y - pvVar4[uVar2 + 4].y;
              textureSize.x = pvVar4[uVar2 + 7].x - pvVar4[uVar2 + 4].x;
              drawBlurQuad(this,uVar2 + 8,first->texture,*(int *)&pNVar3->field_0x34,renderSize,
                           textureSize,(vec2)((ulong)(uint)(1.0 / fVar15) << 0x20));
              goto LAB_0012b6df;
            }
          }
          break;
        case '\x04':
          if (0x3fffffff < uVar2) goto LAB_0012b67a;
          break;
        case '\x05':
          if (0x3fffffff < uVar2) goto LAB_0012b704;
          goto LAB_0012b8e7;
        default:
          if (cVar1 == 'B') {
            pNVar3 = pNVar3[1].m_parent;
            uVar2 = first->vboOffset;
            GVar5 = (*(pNVar3->super_SignalEmitter)._vptr_SignalEmitter[4])(pNVar3);
            format = (*(pNVar3->super_SignalEmitter)._vptr_SignalEmitter[3])(pNVar3);
            last = local_50;
            drawTextureQuad(this,uVar2,GVar5,1.0,format);
          }
          else {
            if (cVar1 != 'A') goto LAB_0012b8e7;
            drawColorQuad(this,first->vboOffset,
                          *(vec4 *)((long)&pNVar3[1].super_SignalEmitter.m_buckets + 4));
          }
          goto LAB_0012ba54;
        }
        if (uVar2 < 0x40000000 || cVar1 != '\x05') {
LAB_0012b8e7:
          if ((uVar2 >> 0x1d & 1) == 0) {
            if (((cVar1 == 'C') &&
                ((fVar15 = *(float *)((long)&pNVar3[1].super_SignalEmitter._vptr_SignalEmitter + 4)
                           - *(float *)&pNVar3->field_0x34, fVar15 != 0.0 || (NAN(fVar15))))) &&
               ((fVar15 = *(float *)&pNVar3[1].super_SignalEmitter.m_buckets -
                          *(float *)&pNVar3[1].super_SignalEmitter._vptr_SignalEmitter,
                fVar15 != 0.0 || (NAN(fVar15))))) {
              if (this->m_activeShader != (Program *)0x0) {
                iVar13 = (this->m_activeShader->super_OpenGLShaderProgram).m_attributeCount;
                glUseProgram(0);
                iVar12 = iVar13;
                if (iVar13 < 0) {
                  do {
                    glEnableVertexAttribArray(iVar12);
                    iVar12 = iVar12 + 1;
                  } while (iVar12 != 0);
                }
                if (0 < iVar13) {
                  iVar13 = iVar13 + 1;
                  do {
                    glDisableVertexAttribArray(iVar13 + -2);
                    iVar13 = iVar13 + -1;
                  } while (1 < iVar13);
                }
                this->m_activeShader = (Program *)0x0;
                last = local_50;
              }
              glBindBuffer(0x8892,0);
              (*(pNVar3->super_SignalEmitter)._vptr_SignalEmitter[5])(pNVar3);
              glBindBuffer(0x8892,this->m_texCoordBuffer);
              glVertexAttribPointer(1,2,0x1406,0,0,0);
              glBindBuffer(0x8892,this->m_vertexBuffer);
              glDisable(0xb71);
              glDisable(0xb90);
              glDepthMask(0);
              glEnable(0xbe2);
              glBlendFunc();
            }
          }
          else if ((uVar2 & 0x1fffffff) != 0) {
            lVar6 = 0x3f;
            if ((uVar2 & 0x1fffffff) != 0) {
              for (; ((ulong)uVar2 & 0x1fffffff) >> lVar6 == 0; lVar6 = lVar6 + -1) {
              }
            }
            std::
            __introsort_loop<rengine::OpenGLRenderer::Element*,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (first + 1,first + ((ulong)uVar2 & 0x1fffffff) + 1,
                       ((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<rengine::OpenGLRenderer::Element*,__gnu_cxx::__ops::_Iter_less_iter>
                      (first + 1,first + ((ulong)uVar2 & 0x1fffffff) + 1);
          }
        }
        else {
LAB_0012b704:
          if (first->texture == 0) goto LAB_0012b8e7;
          uVar2 = first->vboOffset;
          pvVar4 = this->m_vertices;
          local_d8.y = pvVar4[uVar2 + 7].y - pvVar4[uVar2 + 4].y;
          local_d8.x = pvVar4[uVar2 + 7].x - pvVar4[uVar2 + 4].x;
          uStack_d0 = 0;
          local_b8 = pvVar4[uVar2 + 0xb].y - pvVar4[uVar2 + 8].y;
          local_c8.y = local_b8;
          local_c8.x = pvVar4[uVar2 + 0xb].x - pvVar4[uVar2 + 8].x;
          uStack_c0 = 0;
          pmVar8 = local_40;
          pfVar10 = local_1a8;
          fStack_b4 = local_b8;
          fStack_b0 = local_b8;
          fStack_ac = local_b8;
          for (lVar6 = 0x11; lVar6 != 0; lVar6 = lVar6 + -1) {
            *pfVar10 = pmVar8->m[0];
            pmVar8 = (mat4 *)((long)pmVar8 + (ulong)bVar14 * -8 + 4);
            pfVar10 = pfVar10 + (ulong)bVar14 * -2 + 1;
          }
          local_a8 = pNVar3[1].super_SignalEmitter._vptr_SignalEmitter;
          uStack_a0 = 0;
          local_44 = roundf(SUB84(local_a8,0));
          local_7c = roundf(local_a8._4_4_);
          local_98 = 0x3f800000;
          local_90 = 0;
          local_8c = local_44;
          local_88 = 0x3f80000000000000;
          local_80 = 0;
          local_78 = 0;
          local_70 = 0x3f800000;
          local_6c = 0;
          uStack_64 = 0;
          local_5c = 0x13f800000;
          puVar9 = &local_98;
          puVar11 = (undefined8 *)&stack0xfffffffffffffe08;
          for (lVar6 = 8; pmVar8 = local_40, lVar6 != 0; lVar6 = lVar6 + -1) {
            *puVar11 = *puVar9;
            puVar9 = puVar9 + (ulong)bVar14 * -2 + 1;
            puVar11 = puVar11 + (ulong)bVar14 * -2 + 1;
          }
          o.type = 1;
          o.m[0] = in_stack_fffffffffffffe08[0];
          o.m[1] = in_stack_fffffffffffffe08[1];
          o.m[2] = in_stack_fffffffffffffe08[2];
          o.m[3] = in_stack_fffffffffffffe08[3];
          o.m[4] = in_stack_fffffffffffffe08[4];
          o.m[5] = in_stack_fffffffffffffe08[5];
          o.m[6] = in_stack_fffffffffffffe08[6];
          o.m[7] = in_stack_fffffffffffffe08[7];
          o.m[8] = in_stack_fffffffffffffe08[8];
          o.m[9] = in_stack_fffffffffffffe08[9];
          o.m[10] = in_stack_fffffffffffffe08[10];
          o.m[0xb] = in_stack_fffffffffffffe08[0xb];
          o.m[0xc] = in_stack_fffffffffffffe08[0xc];
          o.m[0xd] = in_stack_fffffffffffffe08[0xd];
          o.m[0xe] = in_stack_fffffffffffffe08[0xe];
          o.m[0xf] = in_stack_fffffffffffffe08[0xf];
          mat4::operator*((mat4 *)(storedProj.m + 0xf),local_40,o);
          pfVar10 = storedProj.m + 0xf;
          for (lVar6 = 0x11; lVar6 != 0; lVar6 = lVar6 + -1) {
            pmVar8->m[0] = *pfVar10;
            pfVar10 = pfVar10 + (ulong)bVar14 * -2 + 1;
            pmVar8 = (mat4 *)((long)pmVar8 + (ulong)bVar14 * -8 + 4);
          }
          *(byte *)&this->m_matrixState = (byte)this->m_matrixState | 0x40;
          drawShadowQuad(this,first->vboOffset + 8,first->texture,*(int *)&pNVar3->field_0x34,
                         local_c8,local_d8,(vec2)((ulong)(uint)(1.0 / local_b8) << 0x20),
                         *(vec4 *)&pNVar3[1].super_SignalEmitter.m_buckets);
          pfVar10 = local_1a8;
          pmVar8 = local_40;
          for (lVar6 = 0x11; lVar6 != 0; lVar6 = lVar6 + -1) {
            pmVar8->m[0] = *pfVar10;
            pfVar10 = pfVar10 + (ulong)bVar14 * -2 + 1;
            pmVar8 = (mat4 *)((long)pmVar8 + (ulong)bVar14 * -8 + 4);
          }
          *(byte *)&this->m_matrixState = (byte)this->m_matrixState | 0x40;
          drawTextureQuad(this,first->vboOffset + 0xc,first->sourceTexture,1.0,RGBA_32);
          this_00 = local_38;
          TexturePool::release(local_38,first->texture);
          GVar5 = first->sourceTexture;
LAB_0012b8dd:
          TexturePool::release(this_00,GVar5);
        }
LAB_0012ba54:
        first->field_0x1b = first->field_0x1b | 0x80;
      }
      first = first + 1;
    } while (first < last);
  }
  return;
}

Assistant:

inline void OpenGLRenderer::render(Element *first, Element *last)
{
    // string space;
    // for (int i=0; i<recursion; ++i)
    //     space += "    ";
    // std::cout << space << "render " << first << " -> " << last - 1 << std::endl;

    // Check if we need to flatten something in this range
    if (m_numLayeredNodes > 0) {
        Element *e = first;
        // std::cout << space << "- checking layering for " << e << std::endl;
        while (e < last) {
            if (e->layered) {
                // std::cout << space << "- needs layering: " << e << std::endl;
                // ++recursion;
                renderToLayer(e);
                // --recursion;
                e = e + e->groupSize + 1;
            } else {
                ++e;
            }
        }
    }

    //
    glViewport(0, 0, m_surfaceSize.x, m_surfaceSize.y);

    Element *e = first;
    while (e < last) {
        // std::cout << space << "- render(normal) " << e << " node=(" << e->node << ") " << (e->completed ? "*done*" : "") << std::endl;
        if (e->completed) {
            ++e;
            continue;
        }

        if (e->node->type() == Node::RectangleNodeType) {
            // std::cout << space << "---> rect quad, vbo=" << e->vboOffset
            //      << " " << m_proj * m_vertices[e->vboOffset] << " " << m_proj * m_vertices[e->vboOffset+3] << std::endl;
            drawColorQuad(e->vboOffset, static_cast<RectangleNode *>(e->node)->color());
        } else if (e->node->type() == Node::TextureNodeType) {
            // std::cout << space << "---> texture quad, vbo=" << e->vboOffset << std::endl;
            const Texture *texture = static_cast<TextureNode *>(e->node)->texture();
            drawTextureQuad(e->vboOffset, texture->textureId(), 1.0f, texture->format());
        } else if (e->node->type() == Node::OpacityNodeType && e->layered && e->texture) {
            // std::cout << space << "---> layered texture quad, vbo=" << e->vboOffset << " texture=" << e->texture << std::endl;
            drawTextureQuad(e->vboOffset, e->texture, static_cast<OpacityNode *>(e->node)->opacity());
            m_texturePool.release(e->texture);
        } else if (e->node->type() == Node::ColorFilterNodeType && e->layered && e->texture) {
            // std::cout << space << "---> layered texture quad, vbo=" << e->vboOffset << " texture=" << e->texture << std::endl;
            drawColorFilterQuad(e->vboOffset, e->texture, static_cast<ColorFilterNode *>(e->node)->colorMatrix());
            m_texturePool.release(e->texture);
        } else if (e->node->type() == Node::BlurNodeType && e->layered && e->texture) {
            // std::cout << space << "---> blur texture quad, vbo=" << e->vboOffset << " texture=" << e->texture << std::endl;
            BlurNode *blurNode = static_cast<BlurNode *>(e->node);
            vec2 textureSize = boundingRectFor(e->vboOffset + 4).size();
            vec2 renderSize = boundingRectFor(e->vboOffset + 8).size();
            // std::cout << " - radius: " << blurNode->radius() << " textureSize=" << textureSize << ", renderSize=" << renderSize << std::endl;
            drawBlurQuad(e->vboOffset + 8, e->texture, blurNode->radius(), renderSize, textureSize, vec2(0, 1/renderSize.y));
            m_texturePool.release(e->texture);
        } else if (e->node->type() == Node::ShadowNodeType && e->layered && e->texture) {
            // std::cout << "---> shadow texture quad, vbo=" << e->vboOffset << " texture=" << e->texture << std::endl;
            ShadowNode *shadowNode = static_cast<ShadowNode *>(e->node);
            vec2 textureSize = boundingRectFor(e->vboOffset + 4).size();
            vec2 renderSize = boundingRectFor(e->vboOffset + 8).size();
            mat4 storedProj = m_proj;
            m_proj = m_proj * mat4::translate2D(std::round(shadowNode->offset().x), std::round(shadowNode->offset().y));
            m_matrixState |= UpdateShadowProgram;
            // std::cout << " - radius: " << shadowNode->radius() << " textureSize=" << textureSize << ", renderSize=" << renderSize << std::endl;
            drawShadowQuad(e->vboOffset + 8, e->texture, shadowNode->radius(), renderSize, textureSize, vec2(0, 1/renderSize.y), shadowNode->color());
            m_proj = storedProj;
            m_matrixState |= UpdateShadowProgram;
            drawTextureQuad(e->vboOffset + 12, e->sourceTexture);
            m_texturePool.release(e->texture);
            m_texturePool.release(e->sourceTexture);
        } else if (e->projection) {
            std::sort(e + 1, e + e->groupSize + 1);
            // std::cout << space << "---> projection, sorting range: " << (e+1) << " -> " << (e+e->groupSize) << std::endl;
        } else if (e->node->type() == Node::RenderNodeType) {
            RenderNode *rn = static_cast<RenderNode *>(e->node);
            if (rn->width() != 0 && rn->height() != 0) {
                activateShader(0);
                glBindBuffer(GL_ARRAY_BUFFER, 0);
                rn->render();
                setDefaultOpenGLState();
            }
        }

        e->completed = true;
        ++e;
    }
}